

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmListFileBacktrace __thiscall cmMakefile::GetBacktrace(cmMakefile *this,cmCommandContext *cc)

{
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  cmListFileBacktrace cVar1;
  cmListFileContext lfc;
  undefined1 local_80 [32];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long local_40;
  string local_38;
  
  local_80._0_8_ = local_80 + 0x10;
  local_80._8_8_ = 0;
  local_80[0x10] = '\0';
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = 0;
  std::__cxx11::string::_M_assign((string *)local_80);
  local_40 = *(long *)(in_RDX + 0x40);
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_38,(cmStateSnapshot *)(cc + 10));
  std::__cxx11::string::operator=((string *)&local_60,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  cmListFileBacktrace::Push
            ((cmListFileBacktrace *)this,(cmListFileContext *)((long)&cc[10].Name.Lower.field_2 + 8)
            );
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_80);
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar1.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace(cmCommandContext const& cc) const
{
  cmListFileContext lfc;
  lfc.Name = cc.Name.Original;
  lfc.Line = cc.Line;
  lfc.FilePath = this->StateSnapshot.GetExecutionListFile();
  return this->Backtrace.Push(lfc);
}